

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O0

void __thiscall OpenMD::LocalIndexManager::~LocalIndexManager(LocalIndexManager *this)

{
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232b9f);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232bb0);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232bc1);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232bcf);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232bdd);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232beb);
  IndexListContainer::~IndexListContainer((IndexListContainer *)0x232bf5);
  return;
}

Assistant:

int getNextAtomIndex() { return atomIndexContainer_.pop(); }